

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputSetTag(HelicsInput inp,char *tagname,char *tagvalue,HelicsError *err)

{
  Input *this;
  InputObject *pIVar1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  string_view tag;
  string_view value;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar1 != (InputObject *)0x0) {
    this = pIVar1->inputPtr;
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (tagname != (char *)0x0) {
      sVar2 = strlen(tagname);
      _Var5._M_p = tagname;
    }
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (tagvalue != (char *)0x0) {
      sVar3 = strlen(tagvalue);
      _Var4._M_p = tagvalue;
    }
    tag._M_str = _Var5._M_p;
    tag._M_len = sVar2;
    value._M_str = _Var4._M_p;
    value._M_len = sVar3;
    helics::Interface::setTag(&this->super_Interface,tag,value);
  }
  return;
}

Assistant:

void helicsInputSetTag(HelicsInput inp, const char* tagname, const char* tagvalue, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->setTag(AS_STRING_VIEW(tagname), AS_STRING_VIEW(tagvalue));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}